

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.cpp
# Opt level: O1

stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* util::rpn_parse_v2(stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *__return_storage_ptr__,string *expr)

{
  _Map_pointer ppoVar1;
  byte bVar2;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  op_stack_t *poVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  string *psVar11;
  _Elt_pointer poVar12;
  ulong uVar13;
  _Map_pointer __n;
  _Map_pointer ppbVar14;
  string *psVar15;
  string *str;
  _Map_pointer ppoVar16;
  bool bVar17;
  stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_> op_stack;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  stack;
  Lexer lexer;
  stringstream ss;
  stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_> local_348;
  value_type local_2f0;
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_2c8;
  string *local_2c0;
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b8;
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  Lexer local_210;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  local_268._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_2c8 = (_Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)__return_storage_ptr__;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map(&local_268,0);
  local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_map_size = 8;
  local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)operator_new(0x40);
  uVar10 = local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
           super__Deque_impl_data._M_map_size * 4 - 4 & 0xfffffffffffffff8;
  ppoVar1 = (_Map_pointer)
            ((long)local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                   super__Deque_impl_data._M_map + uVar10);
  ppoVar16 = ppoVar1;
  if (ppoVar1 < (_Map_pointer)
                ((long)local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>.
                       _M_impl.super__Deque_impl_data._M_map + uVar10 + 8)) {
    do {
      poVar7 = (op_stack_t *)operator_new(0x1e0);
      *ppoVar16 = poVar7;
      bVar17 = ppoVar16 < ppoVar1;
      ppoVar16 = ppoVar16 + 1;
    } while (bVar17);
  }
  local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = *ppoVar1;
  local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_start._M_last =
       local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
       super__Deque_impl_data._M_start._M_cur + 0xc;
  local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_start._M_first =
       local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = ppoVar1;
  local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur =
       local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first =
       local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last =
       local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
       super__Deque_impl_data._M_start._M_last;
  local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = ppoVar1;
  std::__cxx11::stringstream::stringstream(local_1b8,(string *)expr,_S_out|_S_in);
  local_2b8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_2b8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_2b8._M_impl.super__Deque_impl_data._M_finish._M_cur = (string *)0x0;
  local_2b8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_2b8._M_impl.super__Deque_impl_data._M_start._M_last = (string *)0x0;
  local_2b8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_2b8._M_impl.super__Deque_impl_data._M_start._M_cur = (string *)0x0;
  local_2b8._M_impl.super__Deque_impl_data._M_start._M_first = (string *)0x0;
  local_2b8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_2b8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map(&local_2b8,0);
  Lexer::Lexer(&local_210,(istream *)local_1b8);
  Lexer::
  Lex<std::front_insert_iterator<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (&local_210,
             (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_2b8);
  if (local_2b8._M_impl.super__Deque_impl_data._M_start._M_cur !=
      local_2b8._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    local_2c0 = local_2b8._M_impl.super__Deque_impl_data._M_start._M_first;
    ppbVar14 = local_2b8._M_impl.super__Deque_impl_data._M_start._M_node;
    psVar15 = local_2b8._M_impl.super__Deque_impl_data._M_start._M_last;
    str = local_2b8._M_impl.super__Deque_impl_data._M_start._M_cur;
    do {
      rpn_map_multichar_op(str);
      bVar2 = *(str->_M_dataplus)._M_p;
      iVar9 = 2;
      bVar17 = false;
      if (0x5d < bVar2) {
        if (bVar2 == 0x5e) {
          iVar9 = 7;
        }
        else {
          if (bVar2 != 0x7c) {
            bVar4 = false;
            bVar5 = false;
            if (bVar2 != 0x7e) goto switchD_001933d3_caseD_22;
            goto switchD_001933d3_caseD_21;
          }
          iVar9 = 8;
        }
        goto LAB_001933e8;
      }
      bVar4 = false;
      bVar5 = false;
      switch(bVar2) {
      case 0x21:
        goto switchD_001933d3_caseD_21;
      case 0x22:
      case 0x23:
      case 0x24:
      case 0x27:
      case 0x2e:
      case 0x30:
      case 0x31:
      case 0x32:
      case 0x33:
      case 0x34:
      case 0x35:
      case 0x36:
      case 0x37:
      case 0x38:
      case 0x39:
      case 0x3a:
      case 0x3b:
switchD_001933d3_caseD_22:
        bVar4 = false;
        bVar17 = true;
        bVar5 = false;
        iVar9 = 0;
        goto switchD_001933d3_caseD_21;
      case 0x25:
      case 0x2a:
      case 0x2f:
        iVar9 = 3;
        break;
      case 0x26:
        iVar9 = 9;
        break;
      case 0x28:
      case 0x29:
        iVar9 = 99;
        bVar4 = true;
        goto LAB_001933f1;
      case 0x2b:
      case 0x2d:
        iVar9 = 4;
        break;
      case 0x2c:
        iVar9 = 0x62;
        bVar5 = true;
        bVar17 = false;
        bVar4 = false;
        goto switchD_001933d3_caseD_21;
      case 0x3c:
      case 0x3e:
switchD_001933d3_caseD_3c:
        iVar9 = 5;
        break;
      case 0x3d:
switchD_001933d3_caseD_3d:
        iVar9 = 6;
        break;
      default:
        switch(bVar2) {
        case 2:
          goto switchD_001933d3_caseD_3d;
        case 3:
        case 4:
          goto switchD_001933d3_caseD_3c;
        case 5:
          iVar9 = 10;
          break;
        case 6:
          iVar9 = 0xb;
          break;
        default:
          goto switchD_001933d3_caseD_22;
        }
      }
LAB_001933e8:
      bVar4 = false;
LAB_001933f1:
      bVar17 = false;
      bVar5 = false;
switchD_001933d3_caseD_21:
      if (bVar17) {
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_268,str);
      }
      else if ((bool)(bVar4 ^ 1) || bVar2 != 0x29) {
        if (iVar9 - 1U < 0x61) {
          lVar8 = (long)str - (long)local_2c0 >> 5;
          uVar10 = lVar8 + 1;
          if (uVar10 < 0x10) {
            psVar11 = str + 1;
          }
          else {
            uVar13 = uVar10 >> 4 | 0xf000000000000000;
            if (-1 < lVar8) {
              uVar13 = uVar10 >> 4;
            }
            psVar11 = ppbVar14[uVar13] + uVar10 + uVar13 * -0x10;
          }
          if (psVar11 != local_2b8._M_impl.super__Deque_impl_data._M_finish._M_cur) {
            if (uVar10 < 0x10) {
              psVar11 = str + 1;
            }
            else {
              uVar13 = uVar10 >> 4 | 0xf000000000000000;
              if (-1 < lVar8) {
                uVar13 = uVar10 >> 4;
              }
              psVar11 = ppbVar14[uVar13] + uVar10 + uVar13 * -0x10;
            }
            bVar2 = *(psVar11->_M_dataplus)._M_p;
            if ((((0x3e < (ulong)bVar2) || ((0x7000bf620000007cU >> ((ulong)bVar2 & 0x3f) & 1) == 0)
                 ) && ((0x20 < bVar2 - 0x5e ||
                       ((0x140000001U >> ((ulong)(bVar2 - 0x5e) & 0x3f) & 1) == 0)))) ||
               (iVar6 = std::__cxx11::string::compare((char *)psVar11), iVar6 == 0)) {
              while (local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_cur !=
                     local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                     super__Deque_impl_data._M_start._M_cur) {
                poVar12 = local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>.
                          _M_impl.super__Deque_impl_data._M_finish._M_cur;
                if (local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_cur ==
                    local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_first) {
                  poVar12 = local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>.
                            _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0xc;
                }
                if (iVar9 <= poVar12[-1].prec) break;
                poVar12 = local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>.
                          _M_impl.super__Deque_impl_data._M_finish._M_cur;
                if (local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_cur ==
                    local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_first) {
                  poVar12 = local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>.
                            _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0xc;
                }
                std::
                deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_268,&poVar12[-1].tok);
                std::stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>::pop
                          (&local_348);
              }
              goto LAB_001937d9;
            }
          }
          if (*(str->_M_dataplus)._M_p == '-') {
            std::__cxx11::string::_M_replace_aux((ulong)str,0,str->_M_string_length,'\x01');
          }
          iVar9 = 1;
          while (local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_cur !=
                 local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                 super__Deque_impl_data._M_start._M_cur) {
            poVar12 = local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl
                      .super__Deque_impl_data._M_finish._M_cur;
            if (local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur ==
                local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
              poVar12 = local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>.
                        _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0xc;
            }
            if (1 < poVar12[-1].prec) break;
            poVar12 = local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl
                      .super__Deque_impl_data._M_finish._M_cur;
            if (local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur ==
                local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
              poVar12 = local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>.
                        _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0xc;
            }
            std::
            deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_268,&poVar12[-1].tok);
            std::stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>::pop
                      (&local_348);
          }
        }
        else if (bVar5) {
          while (local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_cur !=
                 local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                 super__Deque_impl_data._M_start._M_cur) {
            poVar12 = local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl
                      .super__Deque_impl_data._M_finish._M_cur;
            if (local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur ==
                local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
              poVar12 = local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>.
                        _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0xc;
            }
            if (iVar9 < poVar12[-1].prec) break;
            poVar12 = local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl
                      .super__Deque_impl_data._M_finish._M_cur;
            if (local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur ==
                local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
              poVar12 = local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>.
                        _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0xc;
            }
            std::
            deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_268,&poVar12[-1].tok);
            std::stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>::pop
                      (&local_348);
          }
        }
        else if (bVar4) {
          while (local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_cur !=
                 local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                 super__Deque_impl_data._M_start._M_cur) {
            poVar12 = local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl
                      .super__Deque_impl_data._M_finish._M_cur;
            if (local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur ==
                local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
              poVar12 = local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>.
                        _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0xc;
            }
            if (poVar12[-1].prec == 99) {
              std::stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>::pop
                        (&local_348);
              break;
            }
            poVar12 = local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl
                      .super__Deque_impl_data._M_finish._M_cur;
            if (local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur ==
                local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
              poVar12 = local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>.
                        _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0xc;
            }
            std::
            deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_268,&poVar12[-1].tok);
            std::stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>::pop
                      (&local_348);
          }
        }
LAB_001937d9:
        if (iVar9 - 1U < 0x61) {
          local_2f0.tok._M_dataplus._M_p = (pointer)&local_2f0.tok.field_2;
          pcVar3 = (str->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2f0,pcVar3,pcVar3 + str->_M_string_length);
          local_2f0.prec = iVar9;
          std::stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>::push
                    (&local_348,&local_2f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f0.tok._M_dataplus._M_p != &local_2f0.tok.field_2) {
            operator_delete(local_2f0.tok._M_dataplus._M_p,
                            local_2f0.tok.field_2._M_allocated_capacity + 1);
          }
        }
      }
      else {
        local_2f0.tok._M_dataplus._M_p = (pointer)&local_2f0.tok.field_2;
        pcVar3 = (str->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2f0,pcVar3,pcVar3 + str->_M_string_length);
        local_2f0.prec = 99;
        std::stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>::push
                  (&local_348,&local_2f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0.tok._M_dataplus._M_p != &local_2f0.tok.field_2) {
          operator_delete(local_2f0.tok._M_dataplus._M_p,
                          local_2f0.tok.field_2._M_allocated_capacity + 1);
        }
      }
      str = str + 1;
      if (str == psVar15) {
        str = ppbVar14[1];
        ppbVar14 = ppbVar14 + 1;
        psVar15 = str + 0x10;
        local_2c0 = str;
      }
    } while (str != local_2b8._M_impl.super__Deque_impl_data._M_finish._M_cur);
  }
  if (local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur !=
      local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur) {
    do {
      poVar12 = local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur;
      if (local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur ==
          local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
          super__Deque_impl_data._M_finish._M_first) {
        poVar12 = local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_node[-1] + 0xc;
      }
      if (poVar12[-1].prec - 1U < 0x61) {
        poVar12 = local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_cur;
        if (local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur ==
            local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
            super__Deque_impl_data._M_finish._M_first) {
          poVar12 = local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_node[-1] + 0xc;
        }
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_268,&poVar12[-1].tok);
      }
      std::stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>::pop(&local_348);
    } while (local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur !=
             local_348.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur);
  }
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Deque_base(local_2c8,&local_268);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque(&local_210.token_buffer.c);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_2b8);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  std::stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>::~stack(&local_348);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_268);
  return (stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_2c8;
}

Assistant:

std::stack<std::string> rpn_parse_v2(std::string expr)
{
	static const int prec_value = 0;
	static const int prec_unary = 1;
	static const int prec_comma = 98;
	static const int prec_paren = 99;

	auto prec_is_op = [](int prec) { return prec > 0 && prec < 98; };

	auto op_prec = [](char c)
	{
		switch (c)
		{
			case '!': case '~':
				return 2;
			case '*': case '/': case '%':
				return 3;
			case '+': case '-':
				return 4;
			case '<': case op_lte: case '>': case op_gte:
				return 5;
			case '=': case op_ne:
				return 6;
			case '^':
				return 7;
			case '|':
				return 8;
			case '&':
				return 9;
			case op_and:
				return 10;
			case op_or:
				return 11;
			case ',':
				return prec_comma;
			case '(': case ')':
				return prec_paren;
		}

		return prec_value;
	};

	// The result is built up in reverse order
	std::deque<std::string> stack;
	struct op_stack_t { std::string tok; int prec; };
	std::stack<op_stack_t> op_stack;

	std::stringstream ss(expr);
	std::deque<std::string> tokens;
	Lexer lexer(ss);
	lexer.Lex(std::front_inserter(tokens));

	for (auto it = tokens.begin(); it != tokens.end(); ++it)
	{
		auto& tok = *it;
		rpn_map_multichar_op(tok);
		int prec = op_prec(tok[0]);

		if (prec == prec_value)
		{
			stack.push_front(tok);
			continue;
		}

		if (prec == prec_paren && tok[0] == ')')
		{
			op_stack.push({tok, prec});
			continue;
		}

		if (prec_is_op(prec))
		{
			bool is_unary = false;

			if ((it + 1) == tokens.end())
			{
				is_unary = true;
			}
			else
			{
				auto& prev_tok = *(it + 1);
				int prev_prec = op_prec(prev_tok[0]);

				if (prev_prec != 0 && prev_tok != ")")
					is_unary = true;
			}

			if (is_unary)
			{
				prec = prec_unary;

				if (tok[0] == '-')
					tok = op_neg;

				while (!op_stack.empty() && (op_stack.top().prec <= prec))
				{
					stack.push_front(op_stack.top().tok);
					op_stack.pop();
				}
			}
			else
			{
				while (!op_stack.empty() && (op_stack.top().prec < prec))
				{
					stack.push_front(op_stack.top().tok);
					op_stack.pop();
				}
			}
		}
		else if (prec == prec_comma)
		{
			while (!op_stack.empty() && (op_stack.top().prec <= prec))
			{
				stack.push_front(op_stack.top().tok);
				op_stack.pop();
			}
		}
		else if (prec == prec_paren)
		{
			while (!op_stack.empty())
			{
				if (op_stack.top().prec == prec_paren)
				{
					op_stack.pop();
					break;
				}

				stack.push_front(op_stack.top().tok);
				op_stack.pop();
			}
		}

		if (prec_is_op(prec))
			op_stack.push({tok, prec});
	}

	for (; !op_stack.empty(); op_stack.pop())
	{
		int prec = op_stack.top().prec;
		if (prec_is_op(prec))
			stack.push_front(op_stack.top().tok);
	}

	return std::stack<std::string>(std::move(stack));
}